

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

Type * choc::value::Type::createArray
                 (Type *__return_storage_ptr__,Type *elementType,uint32_t numElements)

{
  Content *pCVar1;
  MainType MVar2;
  Allocator *pAVar3;
  RepeatedGroup *pRVar4;
  Object *pOVar5;
  Object *pOVar6;
  uint uVar7;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this;
  
  MVar2 = elementType->mainType;
  pOVar5 = (elementType->content).object;
  pAVar3 = elementType->allocator;
  elementType->mainType = void_;
  if (0xfffff < numElements) {
    throwError("Too many array elements");
  }
  uVar7 = (uint)MVar2;
  if (uVar7 < 0x31) {
    if ((0x1100112UL >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
      __return_storage_ptr__->mainType = primitiveArray;
      (__return_storage_ptr__->content).object =
           (Object *)((ulong)numElements << 0x20 | (ulong)MVar2);
      *(undefined8 *)((long)&__return_storage_ptr__->content + 8) = 0;
      goto LAB_001c020f;
    }
    if ((ulong)uVar7 == 0x30) {
      __return_storage_ptr__->mainType = primitiveArray;
      (__return_storage_ptr__->content).object =
           (Object *)((ulong)numElements << 0x20 | (ulong)pOVar5 & 0xff);
      *(ulong *)((long)&__return_storage_ptr__->content + 8) = (ulong)pOVar5 >> 0x20;
      goto LAB_001c020f;
    }
  }
  this = (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)calloc(1,0x18);
  pOVar5 = (elementType->content).object;
  pOVar6 = *(Object **)((long)&elementType->content + 8);
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve(this,1);
  pRVar4 = this->items;
  uVar7 = this->size;
  pRVar4[uVar7].repetitions = numElements;
  pRVar4[uVar7].elementType.mainType = MVar2;
  pCVar1 = &pRVar4[uVar7].elementType.content;
  pCVar1->object = pOVar5;
  (&pCVar1->object)[1] = pOVar6;
  pRVar4[uVar7].elementType.allocator = pAVar3;
  this->size = this->size + 1;
  __return_storage_ptr__->mainType = complexArray;
  (__return_storage_ptr__->content).complexArray = (ComplexArray *)this;
LAB_001c020f:
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  return __return_storage_ptr__;
}

Assistant:

inline Type::Type (Type&& other) : mainType (other.mainType), content (other.content), allocator (other.allocator)
{
    other.mainType = MainType::void_;
}